

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_attr.cpp
# Opt level: O0

bool __thiscall mocker::FuncAttr::isPureFunc(FuncAttr *this,FunctionModule *func)

{
  __node_base_ptr this_00;
  bool bVar1;
  __type _Var2;
  size_t labelID;
  BasicBlock *this_01;
  InstList *pIVar3;
  element_type *peVar4;
  __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  BasicBlockList *this_03;
  reference this_04;
  reference v;
  element_type *this_05;
  element_type *this_06;
  shared_ptr<mocker::ir::Addr> *psVar5;
  element_type *peVar6;
  element_type *peVar7;
  string *psVar8;
  string *__rhs;
  undefined1 local_140 [8];
  shared_ptr<mocker::ir::Call> call;
  shared_ptr<mocker::ir::Reg> reg_1;
  shared_ptr<mocker::ir::Load> p_1;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Store> p;
  shared_ptr<mocker::ir::IRInst> *inst_1;
  const_iterator __end2;
  const_iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  BasicBlockList *__range1_1;
  int local_9c;
  undefined1 local_98 [8];
  shared_ptr<mocker::ir::Alloca> alloca;
  shared_ptr<mocker::ir::IRInst> *inst;
  const_iterator __end1;
  const_iterator __begin1;
  InstList *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stackVar;
  FunctionModule *func_local;
  FuncAttr *this_local;
  
  stackVar._M_h._M_single_bucket = (__node_base_ptr)func;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1);
  this_00 = stackVar._M_h._M_single_bucket;
  labelID = ir::FunctionModule::getFirstBBLabel((FunctionModule *)stackVar._M_h._M_single_bucket);
  this_01 = ir::FunctionModule::getBasicBlock((FunctionModule *)this_00,labelID);
  pIVar3 = ir::BasicBlock::getInsts_abi_cxx11_(this_01);
  __end1 = std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::begin(pIVar3);
  inst = (shared_ptr<mocker::ir::IRInst> *)
         std::__cxx11::
         list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
         ::end(pIVar3);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&inst), bVar1) {
    alloca.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end1);
    ir::dyc<mocker::ir::Alloca,std::shared_ptr<mocker::ir::IRInst>const&>
              ((ir *)local_98,
               (shared_ptr<mocker::ir::IRInst> *)
               alloca.super___shared_ptr<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_98);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<mocker::ir::Alloca,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_98);
      this_02 = (__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                ir::Definition::getDest(&peVar4->super_Definition);
      peVar6 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_02);
      psVar8 = ir::Reg::getIdentifier_abi_cxx11_(peVar6);
      std::
      unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::emplace<std::__cxx11::string_const&>
                ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&__range1,psVar8);
    }
    std::shared_ptr<mocker::ir::Alloca>::~shared_ptr((shared_ptr<mocker::ir::Alloca> *)local_98);
    std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end1);
  }
  this_03 = ir::FunctionModule::getBBs_abi_cxx11_((FunctionModule *)stackVar._M_h._M_single_bucket);
  __end1_1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
             begin(this_03);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_03);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&bb), bVar1) {
    this_04 = std::_List_const_iterator<mocker::ir::BasicBlock>::operator*(&__end1_1);
    pIVar3 = ir::BasicBlock::getInsts_abi_cxx11_(this_04);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(pIVar3);
    inst_1 = (shared_ptr<mocker::ir::IRInst> *)
             std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::end(pIVar3);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst_1), bVar1) {
      v = std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::dyc<mocker::ir::Store,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,v);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        this_05 = std::
                  __shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
        psVar5 = ir::Store::getAddr(this_05);
        ir::dycLocalReg((ir *)&p_1.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,psVar5);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &p_1.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar1) {
          peVar6 = std::
                   __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&p_1.
                                  super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          psVar8 = ir::Reg::getIdentifier_abi_cxx11_(peVar6);
          bVar1 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range1,psVar8);
          if (!bVar1) goto LAB_001e749f;
          bVar1 = false;
        }
        else {
LAB_001e749f:
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                  ((shared_ptr<mocker::ir::Reg> *)
                   &p_1.super___shared_ptr<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
        if (!bVar1) goto LAB_001e7501;
      }
      else {
LAB_001e7501:
        bVar1 = false;
      }
      std::shared_ptr<mocker::ir::Store>::~shared_ptr
                ((shared_ptr<mocker::ir::Store> *)
                 &reg.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (bVar1) goto LAB_001e77ef;
      ir::dyc<mocker::ir::Load,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,v);
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (bVar1) {
        this_06 = std::
                  __shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Load,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&reg_1.
                                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
        psVar5 = ir::Load::getAddr(this_06);
        ir::dycLocalReg((ir *)&call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount,psVar5);
        bVar1 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar1) {
          peVar6 = std::
                   __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&call.
                                  super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          psVar8 = ir::Reg::getIdentifier_abi_cxx11_(peVar6);
          bVar1 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                            ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range1,psVar8);
          if (!bVar1) goto LAB_001e75d6;
          bVar1 = false;
        }
        else {
LAB_001e75d6:
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr
                  ((shared_ptr<mocker::ir::Reg> *)
                   &call.super___shared_ptr<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (!bVar1) goto LAB_001e7649;
      }
      else {
LAB_001e7649:
        bVar1 = false;
      }
      std::shared_ptr<mocker::ir::Load>::~shared_ptr
                ((shared_ptr<mocker::ir::Load> *)
                 &reg_1.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (bVar1) goto LAB_001e77ef;
      ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>((ir *)local_140,v);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_140);
      if (bVar1) {
        peVar7 = std::
                 __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_140);
        psVar8 = ir::Call::getFuncName_abi_cxx11_(peVar7);
        __rhs = ir::FunctionModule::getIdentifier_abi_cxx11_
                          ((FunctionModule *)stackVar._M_h._M_single_bucket);
        _Var2 = std::operator==(psVar8,__rhs);
        if (_Var2) {
          local_9c = 7;
        }
        else {
          peVar7 = std::
                   __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_140);
          psVar8 = ir::Call::getFuncName_abi_cxx11_(peVar7);
          bVar1 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                            (&this->pureFuncs,psVar8);
          if (bVar1) goto LAB_001e7786;
          this_local._7_1_ = 0;
          local_9c = 1;
        }
      }
      else {
LAB_001e7786:
        local_9c = 0;
      }
      std::shared_ptr<mocker::ir::Call>::~shared_ptr((shared_ptr<mocker::ir::Call> *)local_140);
      if ((local_9c != 0) && (local_9c != 7)) goto LAB_001e77ef;
      std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_const_iterator<mocker::ir::BasicBlock>::operator++(&__end1_1);
  }
  this_local._7_1_ = 1;
LAB_001e77ef:
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FuncAttr::isPureFunc(const ir::FunctionModule &func) {
  std::unordered_set<std::string> stackVar;
  for (auto &inst : func.getBasicBlock(func.getFirstBBLabel()).getInsts()) {
    auto alloca = ir::dyc<ir::Alloca>(inst);
    if (!alloca)
      continue;
    stackVar.emplace(alloca->getDest()->getIdentifier());
  }

  for (auto &bb : func.getBBs()) {
    for (auto &inst : bb.getInsts()) {
      if (auto p = ir::dyc<ir::Store>(inst)) {
        auto reg = ir::dycLocalReg(p->getAddr());
        if (!reg || !isIn(stackVar, reg->getIdentifier()))
          return false;
      }
      if (auto p = ir::dyc<ir::Load>(inst)) {
        auto reg = ir::dycLocalReg(p->getAddr());
        if (!reg || !isIn(stackVar, reg->getIdentifier()))
          return false;
      }
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (call->getFuncName() == func.getIdentifier())
          continue;
        if (!isIn(pureFuncs, call->getFuncName()))
          return false;
      }
    }
  }
  return true;
}